

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseElementDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *pxVar3;
  elementDeclSAXFunc p_Var4;
  xmlParserErrors error;
  int iVar5;
  xmlChar *pxVar6;
  xmlParserInputPtr pxVar7;
  long lVar8;
  char *msg;
  xmlElementContentPtr cur;
  xmlDocPtr doc;
  xmlElementContentPtr content;
  
  content = (xmlElementContentPtr)0x0;
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar7 = ctxt->input;
    pxVar6 = pxVar7->cur;
    if (*pxVar6 != '!') {
      return -1;
    }
    if (pxVar6[1] != 'E') {
      return -1;
    }
    if (pxVar6[2] != 'L') {
      return -1;
    }
    if (pxVar6[3] != 'E') {
      return -1;
    }
    if (pxVar6[4] != 'M') {
      return -1;
    }
    if (pxVar6[5] != 'E') {
      return -1;
    }
    if (pxVar6[6] != 'N') {
      return -1;
    }
    if (pxVar6[7] != 'T') {
      return -1;
    }
    lVar8 = 8;
    iVar5 = 8;
  }
  else {
    if (ctxt->mlType != XML_TYPE_XML) {
      return -1;
    }
    pxVar7 = ctxt->input;
    pxVar6 = pxVar7->cur;
    if (*pxVar6 != '<') {
      return -1;
    }
    if (pxVar6[1] != '!') {
      return -1;
    }
    if (pxVar6[2] != 'E') {
      return -1;
    }
    if (pxVar6[3] != 'L') {
      return -1;
    }
    if (pxVar6[4] != 'E') {
      return -1;
    }
    if (pxVar6[5] != 'M') {
      return -1;
    }
    if (pxVar6[6] != 'E') {
      return -1;
    }
    if (pxVar6[7] != 'N') {
      return -1;
    }
    if (pxVar6[8] != 'T') {
      return -1;
    }
    lVar8 = 9;
    iVar5 = 9;
  }
  iVar2 = pxVar7->id;
  pxVar7->cur = pxVar6 + lVar8;
  pxVar7->col = pxVar7->col + iVar5;
  if (pxVar6[lVar8] == '\0') {
    xmlParserInputGrow(pxVar7,0xfa);
  }
  iVar5 = xmlSkipBlankChars(ctxt);
  if (iVar5 == 0) {
    msg = "Space required after \'ELEMENT\'\n";
    error = XML_ERR_SPACE_REQUIRED;
    goto LAB_00160302;
  }
  pxVar6 = xmlParseName(ctxt);
  if (pxVar6 == (xmlChar *)0x0) {
    msg = "xmlParseElementDecl: no name for Element\n";
    error = XML_ERR_NAME_REQUIRED;
    goto LAB_00160302;
  }
  iVar5 = xmlSkipBlankChars(ctxt);
  if (iVar5 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the element name\n");
  }
  pxVar7 = ctxt->input;
  pxVar3 = pxVar7->cur;
  xVar1 = *pxVar3;
  if (xVar1 == '%') {
    if ((ctxt->external == 0) && (ctxt->inputNr == 1)) {
      msg = "PEReference: forbidden within markup decl in internal subset\n";
      error = XML_ERR_PEREF_IN_INT_SUBSET;
      goto LAB_00160302;
    }
    goto LAB_001602f9;
  }
  if (xVar1 != '(') {
    if (xVar1 == 'A') {
      if ((pxVar3[1] == 'N') && (pxVar3[2] == 'Y')) {
        pxVar7->cur = pxVar3 + 3;
        pxVar7->col = pxVar7->col + 3;
        iVar5 = 2;
        xVar1 = pxVar3[3];
        goto joined_r0x001602cf;
      }
    }
    else if ((((xVar1 == 'E') && (pxVar3[1] == 'M')) && (pxVar3[2] == 'P')) &&
            ((pxVar3[3] == 'T' && (pxVar3[4] == 'Y')))) {
      pxVar7->cur = pxVar3 + 5;
      pxVar7->col = pxVar7->col + 5;
      iVar5 = 1;
      xVar1 = pxVar3[5];
joined_r0x001602cf:
      if (xVar1 == '\0') {
        xmlParserInputGrow(pxVar7,0xfa);
      }
      goto LAB_00160279;
    }
LAB_001602f9:
    msg = "xmlParseElementDecl: \'EMPTY\', \'ANY\' or \'(\' expected\n";
    error = XML_ERR_ELEMCONTENT_NOT_STARTED;
LAB_00160302:
    xmlFatalErrMsg(ctxt,error,msg);
    return -1;
  }
  iVar5 = xmlParseElementContentDecl(ctxt,pxVar6,&content);
LAB_00160279:
  xmlSkipBlankChars(ctxt);
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar7 = ctxt->input;
    if ((*pxVar7->cur == '\n') || (*pxVar7->cur == ';')) goto LAB_0016032f;
LAB_0016039c:
    xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
  }
  else {
    if ((ctxt->mlType != XML_TYPE_XML) || (pxVar7 = ctxt->input, *pxVar7->cur != '>'))
    goto LAB_0016039c;
LAB_0016032f:
    if (iVar2 != pxVar7->id) {
      xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                     "Element declaration doesn\'t start and stop in the same entity\n");
    }
    xmlNextChar(ctxt);
    cur = content;
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var4 = ctxt->sax->elementDecl, p_Var4 != (elementDeclSAXFunc)0x0)) {
      if (content == (xmlElementContentPtr)0x0) {
        (*p_Var4)(ctxt->userData,pxVar6,iVar5,(xmlElementContentPtr)0x0);
        return iVar5;
      }
      content->parent = (_xmlElementContent *)0x0;
      (*p_Var4)(ctxt->userData,pxVar6,iVar5,content);
      if (cur->parent != (_xmlElementContent *)0x0) {
        return iVar5;
      }
      doc = ctxt->myDoc;
      goto LAB_001603bb;
    }
  }
  if (content == (xmlElementContentPtr)0x0) {
    return iVar5;
  }
  doc = ctxt->myDoc;
  cur = content;
LAB_001603bb:
  xmlFreeDocElementContent(doc,cur);
  return iVar5;
}

Assistant:

int
xmlParseElementDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    int ret = -1;
    xmlElementContentPtr content  = NULL;

    DEBUG_ENTER(("xmlParseElementDecl(%s);\n", dbgCtxt(ctxt)));

    /* GROW; done in the caller */
    if (CMP9_MLI(CUR_PTR, '<', '!', 'E', 'L', 'E', 'M', 'E', 'N', 'T')) {
	int inputid = ctxt->input->id;

	SKIP_MLI(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space required after 'ELEMENT'\n");
	    RETURN_INT(-1);
	}
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "xmlParseElementDecl: no name for Element\n");
	    RETURN_INT(-1);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the element name\n");
	}
	if (CMP5(CUR_PTR, 'E', 'M', 'P', 'T', 'Y')) {
	    SKIP(5);
	    /*
	     * Element must always be empty.
	     */
	    ret = XML_ELEMENT_TYPE_EMPTY;
	} else if (CMP3(CUR_PTR, 'A', 'N', 'Y')) {
	    SKIP(3);
	    /*
	     * Element is a generic container.
	     */
	    ret = XML_ELEMENT_TYPE_ANY;
	} else if (RAW == '(') {
	    ret = xmlParseElementContentDecl(ctxt, name, &content);
	} else {
	    /*
	     * [ WFC: PEs in Internal Subset ] error handling.
	     */
	    if ((RAW == '%') && (ctxt->external == 0) &&
	        (ctxt->inputNr == 1)) {
		xmlFatalErrMsg(ctxt, XML_ERR_PEREF_IN_INT_SUBSET,
	  "PEReference: forbidden within markup decl in internal subset\n");
	    } else {
		xmlFatalErrMsg(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
		      "xmlParseElementDecl: 'EMPTY', 'ANY' or '(' expected\n");
            }
	    RETURN_INT(-1);
	}

	SKIP_BLANKS;

	if (!RAW_IS_GT_MLI) { /* (RAW != '>') */
	    xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
	    if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element declaration doesn't start and stop in"
                               " the same entity\n");
	    }

	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->elementDecl != NULL)) {
		if (content != NULL)
		    content->parent = NULL;
	        ctxt->sax->elementDecl(ctxt->userData, name, ret,
		                       content);
		if ((content != NULL) && (content->parent == NULL)) {
		    /*
		     * this is a trick: if xmlAddElementDecl is called,
		     * instead of copying the full tree it is plugged directly
		     * if called from the parser. Avoid duplicating the
		     * interfaces or change the API/ABI
		     */
		    xmlFreeDocElementContent(ctxt->myDoc, content);
		}
	    } else if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	}
    }
    RETURN_INT(ret);
}